

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  char cVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong *puVar12;
  long lVar13;
  bool bVar14;
  HUF_CStream_t bitC;
  
  if (7 < dstSize) {
    bitC.bitPos[0] = 0;
    bitC.bitPos[1] = 0;
    bitC.bitContainer[0] = 0;
    bitC.bitContainer[1] = 0;
    bitC.endPtr = (BYTE *)((long)dst + (dstSize - 8));
    if (dstSize != 8) {
      uVar6 = (uint)*CTable;
      iVar3 = (int)srcSize;
      uVar5 = iVar3 >> 0x1f;
      bitC.ptr = (BYTE *)dst;
      bitC.startPtr = (BYTE *)dst;
      if (uVar6 < 0xc && ((*CTable & 0xffffffff) * srcSize >> 3) + 8 <= dstSize) {
        switch(uVar6) {
        case 7:
          uVar9 = (long)((ulong)uVar5 << 0x20 | srcSize & 0xffffffff) % 8;
          uVar11 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_001b4227:
            if ((srcSize & 7) != 0) {
LAB_001b5138:
              __assert_fail("n % kUnroll == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x3ea8,
                            "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                           );
            }
            if ((srcSize & 8) == 0) {
LAB_001b4306:
              if ((srcSize & 0xf) != 0) {
LAB_001b5157:
                __assert_fail("n % (2 * kUnroll) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3eb4,
                              "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                             );
              }
              lVar2 = (long)(int)srcSize;
              lVar4 = (long)src + lVar2 + -1;
              lVar7 = lVar2 + -9 + (long)src;
              for (; bVar14 = lVar2 == 0, lVar13 = 7, 0 < lVar2; lVar2 = lVar2 + -0x10) {
                while (lVar13 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar4 + -7 + lVar13) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar13 = lVar13 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_001b38e8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar2 + -8 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                uVar11 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
                uVar9 = uVar11 & 0xff;
                if (0x40 < uVar9) goto LAB_001b38e8;
                bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
                puVar12 = (ulong *)(bitC.ptr + (uVar9 >> 3));
                if (bitC.endPtr < puVar12) {
LAB_001b50db:
                  __assert_fail("!kFast || bitC->ptr <= bitC->endPtr",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x3e72,"void HUF_flushBits(HUF_CStream_t *, int)");
                }
                sVar8 = 0;
                uVar9 = 0;
                lVar13 = 7;
                while (lVar13 != 0) {
                  uVar11 = CTable[(ulong)*(byte *)(lVar7 + -7 + lVar13) + 1];
                  if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                  uVar9 = uVar9 >> (uVar11 & 0x3f) | uVar11;
                  sVar8 = sVar8 + uVar11;
                  lVar13 = lVar13 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar8;
                  if (0x40 < ((uint)sVar8 & 0xff)) goto LAB_001b38e8;
                }
                uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -0x10) + 1];
                if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                bitC.bitPos[1] = sVar8 + uVar11;
                bitC.bitContainer[1] = uVar11 & 0xffffffffffffff00 | uVar9 >> (uVar11 & 0x3f);
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_001b38e8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_001b50fa;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar9 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar11 = uVar9 & 0xff;
                if (0x40 < uVar11) goto LAB_001b5119;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar11 == 0) goto LAB_001b509d;
                *puVar12 = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                bitC.ptr = (BYTE *)((uVar11 >> 3) + (long)puVar12);
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                lVar4 = lVar4 + -0x10;
                lVar7 = lVar7 + -0x10;
              }
LAB_001b5058:
              if (!bVar14) {
                __assert_fail("n == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3ecb,
                              "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                             );
              }
              if (bitC.ptr <= bitC.endPtr) {
                sVar8 = HUF_closeCStream(&bitC);
                return sVar8;
              }
              __assert_fail("bitC.ptr <= bitC.endPtr",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x3f16,
                            "size_t HUF_compress1X_usingCTable_internal_body(void *, size_t, const void *, size_t, const HUF_CElt *)"
                           );
            }
            lVar2 = (long)(int)srcSize;
            lVar7 = 7;
            do {
              if (lVar7 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -8) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                uVar11 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
                uVar9 = uVar11 & 0xff;
                if (uVar9 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
                  if (uVar9 == 0) goto LAB_001b509d;
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
                  bitC.ptr = bitC.ptr + (uVar9 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                  srcSize = lVar2 - 8;
                  goto LAB_001b4306;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar7 + lVar2 + -8) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar7 = lVar7 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar10 = (byte *)((long)iVar3 + (long)src);
            do {
              pbVar10 = pbVar10 + -1;
              if ((int)uVar11 < 1) {
                cVar1 = (char)bitC.bitPos[0];
                uVar9 = bitC.bitPos[0] & 0xff;
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                uVar6 = (uint)uVar9;
                if (0x40 < uVar6) goto LAB_001b51b4;
                if (bitC.endPtr < dst) goto LAB_001b50bc;
                *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-cVar1 & 0x3f);
                bitC.ptr = (BYTE *)((long)dst + (ulong)(uVar6 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_001b4227;
                goto LAB_001b50db;
              }
              uVar9 = CTable[(ulong)*pbVar10 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
              uVar11 = (ulong)((int)uVar11 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        case 8:
          uVar9 = (long)((ulong)uVar5 << 0x20 | srcSize & 0xffffffff) % 7;
          uVar11 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_001b44f1:
            uVar6 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 7) != 0)
            goto LAB_001b5138;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 0xe) == 0) {
LAB_001b4c90:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       0xe) != 0) goto LAB_001b5157;
              lVar2 = (long)(int)srcSize;
              lVar4 = (long)src + lVar2 + -1;
              lVar7 = lVar2 + -8 + (long)src;
              for (; bVar14 = lVar2 == 0, lVar13 = 6, 0 < lVar2; lVar2 = lVar2 + -0xe) {
                while (lVar13 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar4 + -6 + lVar13) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar13 = lVar13 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_001b38e8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar2 + -7 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                uVar11 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
                uVar9 = uVar11 & 0xff;
                if (0x40 < uVar9) goto LAB_001b38e8;
                bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
                puVar12 = (ulong *)(bitC.ptr + (uVar9 >> 3));
                if (bitC.endPtr < puVar12) goto LAB_001b50db;
                sVar8 = 0;
                uVar9 = 0;
                lVar13 = 6;
                while (lVar13 != 0) {
                  uVar11 = CTable[(ulong)*(byte *)(lVar7 + -6 + lVar13) + 1];
                  if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                  uVar9 = uVar9 >> (uVar11 & 0x3f) | uVar11;
                  sVar8 = sVar8 + uVar11;
                  lVar13 = lVar13 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar8;
                  if (0x40 < ((uint)sVar8 & 0xff)) goto LAB_001b38e8;
                }
                uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -0xe) + 1];
                if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                bitC.bitPos[1] = sVar8 + uVar11;
                bitC.bitContainer[1] = uVar11 & 0xffffffffffffff00 | uVar9 >> (uVar11 & 0x3f);
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_001b38e8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_001b50fa;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar9 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar11 = uVar9 & 0xff;
                if (0x40 < uVar11) goto LAB_001b5119;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar11 == 0) goto LAB_001b509d;
                *puVar12 = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                bitC.ptr = (BYTE *)((uVar11 >> 3) + (long)puVar12);
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                lVar4 = lVar4 + -0xe;
                lVar7 = lVar7 + -0xe;
              }
              goto LAB_001b5058;
            }
            lVar2 = (long)(int)srcSize;
            lVar7 = 6;
            do {
              if (lVar7 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -7) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                uVar11 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
                uVar9 = uVar11 & 0xff;
                if (uVar9 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
                  if (uVar9 == 0) goto LAB_001b509d;
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
                  bitC.ptr = bitC.ptr + (uVar9 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                  srcSize = lVar2 - 7;
                  goto LAB_001b4c90;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar7 + lVar2 + -7) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar7 = lVar7 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar10 = (byte *)((long)iVar3 + (long)src);
            do {
              pbVar10 = pbVar10 + -1;
              if ((int)uVar11 < 1) {
                cVar1 = (char)bitC.bitPos[0];
                uVar9 = bitC.bitPos[0] & 0xff;
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                uVar6 = (uint)uVar9;
                if (0x40 < uVar6) goto LAB_001b51b4;
                if (bitC.endPtr < dst) goto LAB_001b50bc;
                *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-cVar1 & 0x3f);
                bitC.ptr = (BYTE *)((long)dst + (ulong)(uVar6 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_001b44f1;
                goto LAB_001b50db;
              }
              uVar9 = CTable[(ulong)*pbVar10 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
              uVar11 = (ulong)((int)uVar11 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        case 9:
          uVar9 = (long)((ulong)uVar5 << 0x20 | srcSize & 0xffffffff) % 6;
          uVar11 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_001b4049:
            uVar6 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 6) != 0)
            goto LAB_001b5138;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 0xc) == 0) {
LAB_001b48c0:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       0xc) != 0) goto LAB_001b5157;
              lVar2 = (long)(int)srcSize;
              lVar4 = (long)src + lVar2 + -1;
              lVar7 = lVar2 + -7 + (long)src;
              for (; bVar14 = lVar2 == 0, lVar13 = 5, 0 < lVar2; lVar2 = lVar2 + -0xc) {
                while (lVar13 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar4 + -5 + lVar13) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar13 = lVar13 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_001b38e8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar2 + -6 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                uVar11 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
                uVar9 = uVar11 & 0xff;
                if (0x40 < uVar9) goto LAB_001b38e8;
                bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
                puVar12 = (ulong *)(bitC.ptr + (uVar9 >> 3));
                if (bitC.endPtr < puVar12) goto LAB_001b50db;
                sVar8 = 0;
                uVar9 = 0;
                lVar13 = 5;
                while (lVar13 != 0) {
                  uVar11 = CTable[(ulong)*(byte *)(lVar7 + -5 + lVar13) + 1];
                  if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                  uVar9 = uVar9 >> (uVar11 & 0x3f) | uVar11;
                  sVar8 = sVar8 + uVar11;
                  lVar13 = lVar13 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar8;
                  if (0x40 < ((uint)sVar8 & 0xff)) goto LAB_001b38e8;
                }
                uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -0xc) + 1];
                if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                bitC.bitPos[1] = sVar8 + uVar11;
                bitC.bitContainer[1] = uVar11 & 0xffffffffffffff00 | uVar9 >> (uVar11 & 0x3f);
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_001b38e8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_001b50fa;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar9 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar11 = uVar9 & 0xff;
                if (0x40 < uVar11) goto LAB_001b5119;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar11 == 0) goto LAB_001b509d;
                *puVar12 = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                bitC.ptr = (BYTE *)((uVar11 >> 3) + (long)puVar12);
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                lVar4 = lVar4 + -0xc;
                lVar7 = lVar7 + -0xc;
              }
              goto LAB_001b5058;
            }
            lVar2 = (long)(int)srcSize;
            lVar7 = 5;
            do {
              if (lVar7 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -6) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                uVar11 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
                uVar9 = uVar11 & 0xff;
                if (uVar9 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
                  if (uVar9 == 0) goto LAB_001b509d;
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
                  bitC.ptr = bitC.ptr + (uVar9 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                  srcSize = lVar2 - 6;
                  goto LAB_001b48c0;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar7 + lVar2 + -6) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar7 = lVar7 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar10 = (byte *)((long)iVar3 + (long)src);
            do {
              pbVar10 = pbVar10 + -1;
              if ((int)uVar11 < 1) {
                cVar1 = (char)bitC.bitPos[0];
                uVar9 = bitC.bitPos[0] & 0xff;
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                uVar6 = (uint)uVar9;
                if (0x40 < uVar6) goto LAB_001b51b4;
                if (bitC.endPtr < dst) goto LAB_001b50bc;
                *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-cVar1 & 0x3f);
                bitC.ptr = (BYTE *)((long)dst + (ulong)(uVar6 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_001b4049;
                goto LAB_001b50db;
              }
              uVar9 = CTable[(ulong)*pbVar10 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
              uVar11 = (ulong)((int)uVar11 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        case 10:
          uVar9 = (long)((ulong)uVar5 << 0x20 | srcSize & 0xffffffff) % 5;
          uVar11 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_001b413c:
            uVar6 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 5) != 0)
            goto LAB_001b5138;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 10) == 0) {
LAB_001b4aad:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       10) != 0) goto LAB_001b5157;
              lVar2 = (long)(int)srcSize;
              lVar4 = (long)src + lVar2 + -1;
              lVar7 = lVar2 + -6 + (long)src;
              for (; bVar14 = lVar2 == 0, lVar13 = 4, 0 < lVar2; lVar2 = lVar2 + -10) {
                while (lVar13 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar4 + -4 + lVar13) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar13 = lVar13 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_001b38e8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar2 + -5 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                uVar9 = bitC.bitPos[0] + uVar9;
                uVar11 = uVar9 & 0xff;
                if (0x40 < uVar11) goto LAB_001b38e8;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar11 == 0) goto LAB_001b509d;
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                puVar12 = (ulong *)(bitC.ptr + (uVar11 >> 3));
                if (bitC.endPtr < puVar12) goto LAB_001b50db;
                sVar8 = 0;
                uVar9 = 0;
                lVar13 = 4;
                while (lVar13 != 0) {
                  uVar11 = CTable[(ulong)*(byte *)(lVar7 + -4 + lVar13) + 1];
                  if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                  uVar9 = uVar9 >> (uVar11 & 0x3f) | uVar11;
                  sVar8 = sVar8 + uVar11;
                  lVar13 = lVar13 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar8;
                  if (0x40 < ((uint)sVar8 & 0xff)) goto LAB_001b38e8;
                }
                uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -10) + 1];
                if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                bitC.bitContainer[1] = uVar9 >> (uVar11 & 0x3f) | uVar11;
                bitC.bitPos[1] = sVar8 + uVar11;
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_001b38e8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_001b50fa;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar9 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar11 = uVar9 & 0xff;
                if (0x40 < uVar11) goto LAB_001b5119;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar11 == 0) goto LAB_001b509d;
                *puVar12 = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                bitC.ptr = (BYTE *)((uVar11 >> 3) + (long)puVar12);
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                lVar4 = lVar4 + -10;
                lVar7 = lVar7 + -10;
              }
              goto LAB_001b5058;
            }
            lVar2 = (long)(int)srcSize;
            lVar7 = 4;
            do {
              if (lVar7 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                uVar9 = bitC.bitPos[0] + uVar9;
                uVar11 = uVar9 & 0xff;
                if (uVar11 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                  if (uVar11 == 0) goto LAB_001b509d;
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                  bitC.ptr = bitC.ptr + (uVar11 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                  srcSize = lVar2 - 5;
                  goto LAB_001b4aad;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar7 + lVar2 + -5) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar7 = lVar7 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar10 = (byte *)((long)iVar3 + (long)src);
            do {
              pbVar10 = pbVar10 + -1;
              if ((int)uVar11 < 1) {
                cVar1 = (char)bitC.bitPos[0];
                uVar9 = bitC.bitPos[0] & 0xff;
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                uVar6 = (uint)uVar9;
                if (0x40 < uVar6) goto LAB_001b51b4;
                if (bitC.endPtr < dst) goto LAB_001b50bc;
                *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-cVar1 & 0x3f);
                bitC.ptr = (BYTE *)((long)dst + (ulong)(uVar6 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_001b413c;
                goto LAB_001b50db;
              }
              uVar9 = CTable[(ulong)*pbVar10 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
              uVar11 = (ulong)((int)uVar11 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        case 0xb:
          uVar9 = (long)((ulong)uVar5 << 0x20 | srcSize & 0xffffffff) % 5;
          uVar11 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_001b3f57:
            uVar6 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 5) != 0)
            goto LAB_001b5138;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 10) == 0) {
LAB_001b46d2:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       10) != 0) goto LAB_001b5157;
              lVar2 = (long)(int)srcSize;
              lVar4 = (long)src + lVar2 + -1;
              lVar7 = lVar2 + -6 + (long)src;
              for (; bVar14 = lVar2 == 0, lVar13 = 4, 0 < lVar2; lVar2 = lVar2 + -10) {
                while (lVar13 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar4 + -4 + lVar13) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar13 = lVar13 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_001b38e8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar2 + -5 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                uVar11 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
                uVar9 = uVar11 & 0xff;
                if (0x40 < uVar9) goto LAB_001b38e8;
                bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
                puVar12 = (ulong *)(bitC.ptr + (uVar9 >> 3));
                if (bitC.endPtr < puVar12) goto LAB_001b50db;
                sVar8 = 0;
                uVar9 = 0;
                lVar13 = 4;
                while (lVar13 != 0) {
                  uVar11 = CTable[(ulong)*(byte *)(lVar7 + -4 + lVar13) + 1];
                  if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                  uVar9 = uVar9 >> (uVar11 & 0x3f) | uVar11;
                  sVar8 = sVar8 + uVar11;
                  lVar13 = lVar13 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar8;
                  if (0x40 < ((uint)sVar8 & 0xff)) goto LAB_001b38e8;
                }
                uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -10) + 1];
                if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                bitC.bitPos[1] = sVar8 + uVar11;
                bitC.bitContainer[1] = uVar11 & 0xffffffffffffff00 | uVar9 >> (uVar11 & 0x3f);
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_001b38e8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_001b50fa;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar9 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar11 = uVar9 & 0xff;
                if (0x40 < uVar11) goto LAB_001b5119;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar11 == 0) goto LAB_001b509d;
                *puVar12 = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                bitC.ptr = (BYTE *)((uVar11 >> 3) + (long)puVar12);
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                lVar4 = lVar4 + -10;
                lVar7 = lVar7 + -10;
              }
              goto LAB_001b5058;
            }
            lVar2 = (long)(int)srcSize;
            lVar7 = 4;
            do {
              if (lVar7 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                uVar11 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
                uVar9 = uVar11 & 0xff;
                if (uVar9 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
                  if (uVar9 == 0) goto LAB_001b509d;
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
                  bitC.ptr = bitC.ptr + (uVar9 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                  srcSize = lVar2 - 5;
                  goto LAB_001b46d2;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar7 + lVar2 + -5) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar7 = lVar7 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar10 = (byte *)((long)iVar3 + (long)src);
            do {
              pbVar10 = pbVar10 + -1;
              if ((int)uVar11 < 1) {
                cVar1 = (char)bitC.bitPos[0];
                uVar9 = bitC.bitPos[0] & 0xff;
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                uVar6 = (uint)uVar9;
                if (0x40 < uVar6) goto LAB_001b51b4;
                if (bitC.endPtr < dst) goto LAB_001b50bc;
                *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-cVar1 & 0x3f);
                bitC.ptr = (BYTE *)((long)dst + (ulong)(uVar6 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_001b3f57;
                goto LAB_001b50db;
              }
              uVar9 = CTable[(ulong)*pbVar10 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
              uVar11 = (ulong)((int)uVar11 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        default:
          uVar9 = (long)((ulong)uVar5 << 0x20 | srcSize & 0xffffffff) % 9;
          uVar11 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_001b45e4:
            uVar6 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 9) != 0)
            goto LAB_001b5138;
            if ((int)((long)((ulong)uVar6 << 0x20 | srcSize & 0xffffffff) % 0x12) == 0) {
LAB_001b4e7d:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       0x12) != 0) goto LAB_001b5157;
              lVar2 = (long)(int)srcSize;
              lVar4 = (long)src + lVar2 + -1;
              lVar7 = lVar2 + -10 + (long)src;
              for (; bVar14 = lVar2 == 0, lVar13 = 8, 0 < lVar2; lVar2 = lVar2 + -0x12) {
                while (lVar13 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar4 + -8 + lVar13) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar13 = lVar13 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_001b38e8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar2 + -9 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                uVar9 = bitC.bitPos[0] + uVar9;
                uVar11 = uVar9 & 0xff;
                if (0x40 < uVar11) goto LAB_001b38e8;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar11 == 0) goto LAB_001b509d;
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                puVar12 = (ulong *)(bitC.ptr + (uVar11 >> 3));
                if (bitC.endPtr < puVar12) goto LAB_001b50db;
                sVar8 = 0;
                uVar9 = 0;
                lVar13 = 8;
                while (lVar13 != 0) {
                  uVar11 = CTable[(ulong)*(byte *)(lVar7 + -8 + lVar13) + 1];
                  if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                  uVar9 = uVar9 >> (uVar11 & 0x3f) | uVar11;
                  sVar8 = sVar8 + uVar11;
                  lVar13 = lVar13 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar8;
                  if (0x40 < ((uint)sVar8 & 0xff)) goto LAB_001b38e8;
                }
                uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -0x12) + 1];
                if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                bitC.bitContainer[1] = uVar9 >> (uVar11 & 0x3f) | uVar11;
                bitC.bitPos[1] = sVar8 + uVar11;
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_001b38e8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_001b50fa;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar9 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar11 = uVar9 & 0xff;
                if (0x40 < uVar11) goto LAB_001b5119;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar11 == 0) goto LAB_001b509d;
                *puVar12 = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                bitC.ptr = (BYTE *)((uVar11 >> 3) + (long)puVar12);
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                lVar4 = lVar4 + -0x12;
                lVar7 = lVar7 + -0x12;
              }
              goto LAB_001b5058;
            }
            lVar2 = (long)(int)srcSize;
            lVar7 = 8;
            do {
              if (lVar7 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -9) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                uVar9 = bitC.bitPos[0] + uVar9;
                uVar11 = uVar9 & 0xff;
                if (uVar11 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                  if (uVar11 == 0) goto LAB_001b509d;
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
                  bitC.ptr = bitC.ptr + (uVar11 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_001b50db;
                  srcSize = lVar2 - 9;
                  goto LAB_001b4e7d;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar7 + lVar2 + -9) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar7 = lVar7 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar10 = (byte *)((long)iVar3 + (long)src);
            do {
              pbVar10 = pbVar10 + -1;
              if ((int)uVar11 < 1) {
                cVar1 = (char)bitC.bitPos[0];
                uVar9 = bitC.bitPos[0] & 0xff;
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                uVar6 = (uint)uVar9;
                if (0x40 < uVar6) goto LAB_001b51b4;
                if (bitC.endPtr < dst) goto LAB_001b50bc;
                *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-cVar1 & 0x3f);
                bitC.ptr = (BYTE *)((long)dst + (ulong)(uVar6 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_001b45e4;
                goto LAB_001b50db;
              }
              uVar9 = CTable[(ulong)*pbVar10 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
              uVar11 = (ulong)((int)uVar11 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
        }
      }
      else {
        uVar9 = (long)((ulong)uVar5 << 0x20 | srcSize & 0xffffffff) % 4;
        uVar11 = uVar9 & 0xffffffff;
        if ((int)uVar9 < 1) {
LAB_001b3888:
          if ((srcSize & 3) != 0) goto LAB_001b5138;
          if ((srcSize & 4) == 0) {
LAB_001b397b:
            if ((srcSize & 7) != 0) goto LAB_001b5157;
            lVar2 = (long)(int)srcSize;
            lVar4 = (long)src + lVar2 + -1;
            lVar7 = lVar2 + -5 + (long)src;
            for (; bVar14 = lVar2 == 0, lVar13 = 3, 0 < lVar2; lVar2 = lVar2 + -8) {
              while (lVar13 != 0) {
                uVar9 = CTable[(ulong)*(byte *)(lVar4 + -3 + lVar13) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
                bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                lVar13 = lVar13 + -1;
                if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_001b38e8;
              }
              uVar9 = CTable[(ulong)*(byte *)(lVar2 + -4 + (long)src) + 1];
              if (0xc < (uVar9 & 0xff)) {
LAB_001b507e:
                __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e2b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
              }
              uVar11 = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
              uVar9 = uVar11 & 0xff;
              if (0x40 < uVar9) goto LAB_001b38e8;
              bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
              if (uVar9 == 0) {
LAB_001b509d:
                __assert_fail("nbBits > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e6d,"void HUF_flushBits(HUF_CStream_t *, int)");
              }
              if (bitC.endPtr < bitC.ptr) {
LAB_001b50bc:
                __assert_fail("bitC->ptr <= bitC->endPtr",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e6f,"void HUF_flushBits(HUF_CStream_t *, int)");
              }
              *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
              puVar12 = (ulong *)(bitC.ptr + (uVar9 >> 3));
              if (bitC.endPtr < bitC.ptr + (uVar9 >> 3)) {
                puVar12 = (ulong *)bitC.endPtr;
              }
              sVar8 = 0;
              uVar9 = 0;
              lVar13 = 3;
              while (lVar13 != 0) {
                uVar11 = CTable[(ulong)*(byte *)(lVar7 + -3 + lVar13) + 1];
                if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
                uVar9 = uVar9 >> (uVar11 & 0x3f) | uVar11;
                sVar8 = sVar8 + uVar11;
                lVar13 = lVar13 + -1;
                bitC.bitContainer[1] = uVar9;
                bitC.bitPos[1] = sVar8;
                if (0x40 < ((uint)sVar8 & 0xff)) goto LAB_001b38e8;
              }
              uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -8) + 1];
              if (0xc < (uVar11 & 0xff)) goto LAB_001b507e;
              bitC.bitPos[1] = sVar8 + uVar11;
              bitC.bitContainer[1] = uVar11 & 0xffffffffffffff00 | uVar9 >> (uVar11 & 0x3f);
              if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_001b38e8;
              if ((int)(bitC.bitPos[1] & 0xff) == 0x40) {
LAB_001b50fa:
                __assert_fail("(bitC->bitPos[1] & 0xFF) < HUF_BITS_IN_CONTAINER",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e56,"void HUF_mergeIndex1(HUF_CStream_t *)");
              }
              bitC.bitContainer[0] =
                   bitC.bitContainer[0] >> (bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
              uVar9 = bitC.bitPos[1] + bitC.bitPos[0];
              uVar11 = uVar9 & 0xff;
              if (0x40 < uVar11) {
LAB_001b5119:
                __assert_fail("(bitC->bitPos[0] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e5a,"void HUF_mergeIndex1(HUF_CStream_t *)");
              }
              bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
              if (uVar11 == 0) goto LAB_001b509d;
              *puVar12 = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar9 & 0x3f);
              bitC.ptr = (BYTE *)((uVar11 >> 3) + (long)puVar12);
              if (bitC.endPtr < bitC.ptr) {
                bitC.ptr = bitC.endPtr;
              }
              lVar4 = lVar4 + -8;
              lVar7 = lVar7 + -8;
            }
            goto LAB_001b5058;
          }
          lVar2 = (long)(int)srcSize;
          lVar7 = 3;
          do {
            if (lVar7 == 0) {
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -4) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
              uVar11 = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
              uVar9 = uVar11 & 0xff;
              if (uVar9 < 0x41) {
                bitC.bitPos[0] = (size_t)((uint)uVar11 & 7);
                if (uVar9 == 0) goto LAB_001b509d;
                if (bitC.endPtr < bitC.ptr) goto LAB_001b50bc;
                srcSize = lVar2 - 4;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> ((ulong)(byte)-(char)uVar11 & 0x3f);
                bitC.ptr = bitC.ptr + (uVar9 >> 3);
                if (bitC.endPtr < bitC.ptr) {
                  bitC.ptr = bitC.endPtr;
                }
                goto LAB_001b397b;
              }
              break;
            }
            uVar9 = CTable[(ulong)*(byte *)((long)src + lVar7 + lVar2 + -4) + 1];
            if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
            bitC.bitContainer[0] = bitC.bitContainer[0] >> (uVar9 & 0x3f) | uVar9;
            bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
            lVar7 = lVar7 + -1;
          } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
        }
        else {
          pbVar10 = (byte *)((long)iVar3 + (long)src);
          do {
            pbVar10 = pbVar10 + -1;
            if ((int)uVar11 < 1) {
              cVar1 = (char)bitC.bitPos[0];
              uVar9 = bitC.bitPos[0] & 0xff;
              bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
              if (uVar9 == 0) goto LAB_001b509d;
              uVar6 = (uint)uVar9;
              if (0x40 < uVar6) {
LAB_001b51b4:
                __assert_fail("nbBits <= sizeof(bitC->bitContainer[0]) * 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e6e,"void HUF_flushBits(HUF_CStream_t *, int)");
              }
              if (bitC.endPtr < dst) goto LAB_001b50bc;
              bitC.ptr = (BYTE *)((ulong)(uVar6 >> 3) + (long)dst);
              if (bitC.endPtr < bitC.ptr) {
                bitC.ptr = bitC.endPtr;
              }
              *(size_t *)dst = bitC.bitContainer[0] >> ((ulong)(byte)-cVar1 & 0x3f);
              goto LAB_001b3888;
            }
            uVar9 = CTable[(ulong)*pbVar10 + 1];
            if (0xc < (uVar9 & 0xff)) goto LAB_001b507e;
            bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
            bitC.bitContainer[0] =
                 uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> (uVar9 & 0x3f);
            uVar11 = (ulong)((int)uVar11 - 1);
            srcSize = (size_t)((int)srcSize - 1);
          } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
        }
      }
LAB_001b38e8:
      __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3e37,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
    }
  }
  return 0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = (U32)CTable[0];
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}